

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exper.c
# Opt level: O2

int experience(monst *mtmp,int nk)

{
  byte bVar1;
  char cVar2;
  permonst *ppVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  uint uVar7;
  
  ppVar3 = mtmp->data;
  bVar1 = mtmp->m_lev;
  iVar4 = find_mac(mtmp);
  lVar6 = 0;
  iVar5 = 7 - iVar4 << (byte)((uint)iVar4 >> 0x1f);
  if (2 < iVar4) {
    iVar5 = 0;
  }
  cVar2 = ppVar3->mmove;
  iVar4 = ('\x12' < cVar2) + 3 + (uint)('\x12' < cVar2);
  if (cVar2 < '\r') {
    iVar4 = 0;
  }
  iVar5 = iVar4 + iVar5 + (uint)bVar1 * (uint)bVar1 + 1;
  for (; lVar6 != 6; lVar6 = lVar6 + 1) {
    bVar1 = ppVar3->mattk[lVar6].aatyp;
    if (4 < bVar1) {
      if (bVar1 == 0xff) {
        iVar5 = iVar5 + 10;
      }
      else if (bVar1 == 0xfe) {
        iVar5 = iVar5 + 5;
      }
      else {
        iVar5 = iVar5 + 3;
      }
    }
  }
  for (lVar6 = 0; lVar6 != 6; lVar6 = lVar6 + 1) {
    bVar1 = ppVar3->mattk[lVar6].adtyp;
    if ((byte)(bVar1 - 1) < 10) {
      uVar7 = (uint)mtmp->m_lev * 2;
    }
    else if ((0x28 < bVar1) ||
            (uVar7 = 0x32, (0x10000048000U >> ((ulong)(uint)bVar1 & 0x3f) & 1) == 0)) {
      uVar7 = (uint)mtmp->m_lev;
    }
    iVar4 = uVar7 + iVar5;
    if (0x17 < (uint)ppVar3->mattk[lVar6].damn * (uint)ppVar3->mattk[lVar6].damd) {
      iVar4 = iVar4 + (uint)mtmp->m_lev;
    }
    iVar5 = iVar4;
    if ((((bVar1 == 0x1c) && (ppVar3->mlet == '9')) && (u.uprops[0x31].intrinsic == 0)) &&
       ((u.uprops[0x31].extrinsic == 0 &&
        (iVar5 = iVar4 + 1000, ((youmonst.data)->mflags1 & 0x600) != 0)))) {
      iVar5 = iVar4;
    }
  }
  iVar4 = iVar5 + 0x32;
  if (mtmp->m_lev < 9) {
    iVar4 = iVar5;
  }
  return iVar4 + ((uint)mtmp->m_lev * 7 & (int)(ppVar3->mflags2 << 6) >> 0x1f);
}

Assistant:

int experience(struct monst *mtmp, int nk)
{
	const struct permonst *ptr = mtmp->data;
	int	i, tmp, tmp2;

	tmp = 1 + mtmp->m_lev * mtmp->m_lev;

/*	For higher ac values, give extra experience */
	if ((i = find_mac(mtmp)) < 3) tmp += (7 - i) * ((i < 0) ? 2 : 1);

/*	For very fast monsters, give extra experience */
	if (ptr->mmove > NORMAL_SPEED)
	    tmp += (ptr->mmove > (3*NORMAL_SPEED/2)) ? 5 : 3;

/*	For each "special" attack type give extra experience */
	for (i = 0; i < NATTK; i++) {

	    tmp2 = ptr->mattk[i].aatyp;
	    if (tmp2 > AT_BUTT) {

		if (tmp2 == AT_WEAP) tmp += 5;
		else if (tmp2 == AT_MAGC) tmp += 10;
		else tmp += 3;
	    }
	}

/*	For each "special" damage type give extra experience */
	for (i = 0; i < NATTK; i++) {
	    tmp2 = ptr->mattk[i].adtyp;
	    if (tmp2 > AD_PHYS && tmp2 < AD_BLND) tmp += 2*mtmp->m_lev;
	    else if ((tmp2 == AD_DRLI) || (tmp2 == AD_STON) ||
	    		(tmp2 == AD_SLIM)) tmp += 50;
	    else if (tmp != AD_PHYS) tmp += mtmp->m_lev;
		/* extra heavy damage bonus */
	    if ((int)(ptr->mattk[i].damd * ptr->mattk[i].damn) > 23)
		tmp += mtmp->m_lev;
	    if (tmp2 == AD_WRAP && ptr->mlet == S_EEL && !Amphibious)
		tmp += 1000;
	}

/*	For certain "extra nasty" monsters, give even more */
	if (extra_nasty(ptr)) tmp += (7 * mtmp->m_lev);

/*	For higher level monsters, an additional bonus is given */
	if (mtmp->m_lev > 8) tmp += 50;

	return tmp;
}